

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseIdentifierExpression(Parser *this)

{
  Token *this_00;
  TokenType TVar1;
  TokenType TVar2;
  FunctionCallExpression *this_01;
  CalculationEngine *this_02;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  Parser *this_03;
  allocator local_e9;
  vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
  arguments;
  undefined1 local_d0 [8];
  string identifier;
  vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  
  this_00 = &in_RSI->mCurrentToken;
  Token::identifier_abi_cxx11_(&identifier,this_00);
  nextToken(in_RSI);
  TVar1 = Token::type(this_00);
  if (TVar1 == LEFT_PARENTHESIS) {
    nextToken(in_RSI);
    arguments.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arguments.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar1 = Token::type(this_00);
    if (TVar1 != RIGHT_PARENTHESIS) {
      do {
        parseExpression((Parser *)local_d0);
        std::
        vector<std::unique_ptr<Expression,std::default_delete<Expression>>,std::allocator<std::unique_ptr<Expression,std::default_delete<Expression>>>>
        ::emplace_back<std::unique_ptr<Expression,std::default_delete<Expression>>>
                  ((vector<std::unique_ptr<Expression,std::default_delete<Expression>>,std::allocator<std::unique_ptr<Expression,std::default_delete<Expression>>>>
                    *)&arguments,
                   (unique_ptr<Expression,_std::default_delete<Expression>_> *)local_d0);
        TVar1 = Token::type(this_00);
        if (TVar1 != RIGHT_PARENTHESIS) {
          TVar2 = Token::type(this_00);
          if (TVar2 != COMMA) {
            this_03 = (Parser *)&stack0xffffffffffffffb0;
            std::__cxx11::string::string
                      ((string *)this_03,"Expected \',\' or \')\' in argument list.",&local_e9);
            parseError(this_03,(string *)&stack0xffffffffffffffb0);
            std::
            vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
            ::~vector(&local_a8);
            std::__cxx11::string::~string((string *)&local_90);
            operator_delete(in_RSI,0x40);
            std::
            vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
            ::~vector(&arguments);
            std::__cxx11::string::~string((string *)&identifier);
            _Unwind_Resume(extraout_RAX);
          }
          nextToken(in_RSI);
        }
        if (local_d0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_d0 + 8))();
        }
      } while (TVar1 != RIGHT_PARENTHESIS);
    }
    nextToken(in_RSI);
    this_01 = (FunctionCallExpression *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_90,(string *)&identifier);
    local_a8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         arguments.
         super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         arguments.
         super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_a8.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         arguments.
         super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    arguments.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arguments.
    super__Vector_base<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FunctionCallExpression::FunctionCallExpression(this_01,&local_90,&local_a8);
    this->mCalcEngine = (CalculationEngine *)this_01;
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::~vector(&local_a8);
    std::__cxx11::string::~string((string *)&local_90);
    std::
    vector<std::unique_ptr<Expression,_std::default_delete<Expression>_>,_std::allocator<std::unique_ptr<Expression,_std::default_delete<Expression>_>_>_>
    ::~vector(&arguments);
  }
  else {
    this_02 = (CalculationEngine *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_70,(string *)&identifier);
    VariableExpression::VariableExpression((VariableExpression *)this_02,&local_70);
    this->mCalcEngine = this_02;
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&identifier);
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseIdentifierExpression() {
	std::string identifier = mCurrentToken.identifier();

	//Eat the identifier.
	nextToken();

	if (mCurrentToken.type() != TokenType::LEFT_PARENTHESIS) {
		return std::unique_ptr<VariableExpression>(new VariableExpression(identifier));
	}

	//Function call
	nextToken(); //Eat the '('
	std::vector<std::unique_ptr<Expression>> arguments;

	if (mCurrentToken.type() != TokenType::RIGHT_PARENTHESIS) {
		while (true) {
			auto arg = parseExpression();
			arguments.push_back(std::move(arg));

			if (mCurrentToken.type() == TokenType::RIGHT_PARENTHESIS) {
				break;
			}

			if (mCurrentToken.type() != TokenType::COMMA) {
				parseError("Expected ',' or ')' in argument list.");
			}

			nextToken();
		}
	}

	//Eat the ')'
	nextToken();

	return std::unique_ptr<FunctionCallExpression>(
		new FunctionCallExpression(identifier, std::move(arguments)));
}